

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,_testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  internal *this;
  undefined8 uVar3;
  char *pcVar4;
  int line;
  char *str;
  CodeLocation local_100;
  CodeLocation local_d8;
  CodeLocation *local_b0;
  CodeLocation *test_location;
  string local_78;
  undefined1 local_58 [8];
  string test_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_local;
  char *test_names_local;
  char *case_name_local;
  TypedTestSuitePState *state_local;
  CodeLocation *code_location_local;
  char *prefix_local;
  
  pcVar4 = case_name;
  test_name.field_2._8_8_ = type_names;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  line = (int)pcVar4;
  GetPrefixUntilComma_abi_cxx11_(&local_78,(internal *)test_names,str);
  StripTrailingSpaces((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = TypedTestSuitePState::TestExists(state,(string *)local_58);
  __stream = _stderr;
  if (!bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    this = (internal *)std::__cxx11::string::c_str();
    FormatFileLocation_abi_cxx11_
              ((string *)&test_location,this,(char *)(ulong)(uint)code_location->line,line);
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"Failed to get code location for test %s.%s at %s.",case_name,uVar2,uVar3);
    std::__cxx11::string::~string((string *)&test_location);
    fflush(_stderr);
    posix::Abort();
  }
  local_b0 = TypedTestSuitePState::GetCodeLocation(state,(string *)local_58);
  CodeLocation::CodeLocation(&local_d8,local_b0);
  TypeParameterizedTest<bssl::PkitsTest08CertificatePolicies,_testing::internal::TemplateSel<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
  ::Register(prefix,&local_d8,case_name,test_names,0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)test_name.field_2._8_8_);
  CodeLocation::~CodeLocation(&local_d8);
  CodeLocation::CodeLocation(&local_100,code_location);
  pcVar4 = SkipComma(test_names);
  bVar1 = TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,_testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
          ::Register(prefix,&local_100,state,case_name,pcVar4,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)test_name.field_2._8_8_);
  CodeLocation::~CodeLocation(&local_100);
  std::__cxx11::string::~string((string *)local_58);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }